

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O0

void __thiscall xray_re::xr_skl_motion::xr_skl_motion(xr_skl_motion *this)

{
  xr_skl_motion *this_local;
  
  xr_motion::xr_motion(&this->super_xr_motion,MT_SKELETON);
  (this->super_xr_motion)._vptr_xr_motion = (_func_int **)&PTR__xr_skl_motion_0038e248;
  std::vector<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>::vector
            (&this->m_bone_motions);
  this->m_bone_or_part = 0xffff;
  this->m_speed = 1.0;
  this->m_accrue = 2.0;
  this->m_falloff = 2.0;
  this->m_power = 1.0;
  this->m_flags = 0;
  std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>::vector
            (&this->m_marks);
  return;
}

Assistant:

xr_skl_motion::xr_skl_motion(): xr_motion(MT_SKELETON),
	m_bone_or_part(ALL_PARTITIONS),
	m_speed(1.f), m_accrue(2.f), m_falloff(2.f), m_power(1.f),
	m_flags(0) {}